

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<float> * __thiscall
Imath_2_5::Matrix44<float>::setEulerAngles<float>(Matrix44<float> *this,Vec3<float> *r)

{
  float *pfVar1;
  Vec3<float> *in_RSI;
  Matrix44<float> *in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  float sin_rx;
  float cos_rx;
  float sin_ry;
  float cos_ry;
  float sin_rz;
  float cos_rz;
  
  pfVar1 = Vec3<float>::operator[](in_RSI,2);
  dVar8 = Math<float>::cos((double)(ulong)(uint)*pfVar1);
  fVar2 = SUB84(dVar8,0);
  pfVar1 = Vec3<float>::operator[](in_RSI,1);
  dVar8 = Math<float>::cos((double)(ulong)(uint)*pfVar1);
  fVar3 = SUB84(dVar8,0);
  pfVar1 = Vec3<float>::operator[](in_RSI,0);
  dVar8 = Math<float>::cos((double)(ulong)(uint)*pfVar1);
  fVar4 = SUB84(dVar8,0);
  pfVar1 = Vec3<float>::operator[](in_RSI,2);
  dVar8 = Math<float>::sin((double)(ulong)(uint)*pfVar1);
  fVar5 = SUB84(dVar8,0);
  pfVar1 = Vec3<float>::operator[](in_RSI,1);
  dVar8 = Math<float>::sin((double)(ulong)(uint)*pfVar1);
  fVar6 = SUB84(dVar8,0);
  pfVar1 = Vec3<float>::operator[](in_RSI,0);
  dVar8 = Math<float>::sin((double)(ulong)(uint)*pfVar1);
  fVar7 = SUB84(dVar8,0);
  in_RDI->x[0][0] = fVar2 * fVar3;
  in_RDI->x[0][1] = fVar5 * fVar3;
  in_RDI->x[0][2] = -fVar6;
  in_RDI->x[0][3] = 0.0;
  in_RDI->x[1][0] = -fVar5 * fVar4 + fVar2 * fVar6 * fVar7;
  in_RDI->x[1][1] = fVar2 * fVar4 + fVar5 * fVar6 * fVar7;
  in_RDI->x[1][2] = fVar3 * fVar7;
  in_RDI->x[1][3] = 0.0;
  in_RDI->x[2][0] = fVar5 * fVar7 + fVar2 * fVar6 * fVar4;
  in_RDI->x[2][1] = -fVar2 * fVar7 + fVar5 * fVar6 * fVar4;
  in_RDI->x[2][2] = fVar3 * fVar4;
  in_RDI->x[2][3] = 0.0;
  in_RDI->x[3][0] = 0.0;
  in_RDI->x[3][1] = 0.0;
  in_RDI->x[3][2] = 0.0;
  in_RDI->x[3][3] = 1.0;
  return in_RDI;
}

Assistant:

const Matrix44<T> &
Matrix44<T>::setEulerAngles (const Vec3<S>& r)
{
    S cos_rz, sin_rz, cos_ry, sin_ry, cos_rx, sin_rx;
    
    cos_rz = Math<T>::cos (r[2]);
    cos_ry = Math<T>::cos (r[1]);
    cos_rx = Math<T>::cos (r[0]);
    
    sin_rz = Math<T>::sin (r[2]);
    sin_ry = Math<T>::sin (r[1]);
    sin_rx = Math<T>::sin (r[0]);
    
    x[0][0] =  cos_rz * cos_ry;
    x[0][1] =  sin_rz * cos_ry;
    x[0][2] = -sin_ry;
    x[0][3] =  0;
    
    x[1][0] = -sin_rz * cos_rx + cos_rz * sin_ry * sin_rx;
    x[1][1] =  cos_rz * cos_rx + sin_rz * sin_ry * sin_rx;
    x[1][2] =  cos_ry * sin_rx;
    x[1][3] =  0;
    
    x[2][0] =  sin_rz * sin_rx + cos_rz * sin_ry * cos_rx;
    x[2][1] = -cos_rz * sin_rx + sin_rz * sin_ry * cos_rx;
    x[2][2] =  cos_ry * cos_rx;
    x[2][3] =  0;

    x[3][0] =  0;
    x[3][1] =  0;
    x[3][2] =  0;
    x[3][3] =  1;

    return *this;
}